

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateOneElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlNs **ppxVar1;
  _xmlElementContent *p_Var2;
  int iVar3;
  int iVar4;
  xmlElementPtr elemDecl;
  xmlNs *pxVar5;
  xmlChar *pxVar6;
  char *pcVar7;
  xmlParserErrors xVar8;
  xmlNodePtr elem_00;
  byte *pbVar9;
  xmlElementContentPtr pxVar10;
  ulong uVar11;
  xmlChar *pxVar12;
  xmlNodePtr in_R8;
  _xmlAttr *p_Var13;
  _xmlNode *p_Var14;
  xmlAttributePtr pxVar15;
  int iVar16;
  int extsubset;
  xmlChar fn [50];
  xmlChar *pxVar17;
  int local_74;
  undefined8 local_70;
  xmlChar local_68 [56];
  
  local_74 = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  iVar16 = 1;
  switch(elem->type) {
  case XML_ELEMENT_NODE:
    elemDecl = xmlValidGetElemDecl(ctxt,doc,elem,&local_74);
    if (elemDecl == (xmlElementPtr)0x0) {
      return 0;
    }
    iVar16 = 1;
    if (ctxt->vstateNr != 0) goto switchD_0019259f_caseD_2;
    switch(elemDecl->etype) {
    case XML_ELEMENT_TYPE_UNDEFINED:
      pxVar12 = elem->name;
      pcVar7 = "No declaration for element %s\n";
      xVar8 = XML_DTD_UNKNOWN_ELEM;
      goto LAB_00192552;
    case XML_ELEMENT_TYPE_EMPTY:
      if (elem->children == (_xmlNode *)0x0) goto switchD_0019259f_caseD_2;
      pxVar12 = elem->name;
      pcVar7 = "Element %s was declared EMPTY this one has content\n";
      xVar8 = XML_DTD_NOT_EMPTY;
      break;
    default:
      goto switchD_0019259f_caseD_2;
    case XML_ELEMENT_TYPE_MIXED:
      if ((elemDecl->content == (xmlElementContentPtr)0x0) ||
         (elemDecl->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
        p_Var14 = elem->children;
        if (p_Var14 != (_xmlNode *)0x0) {
          iVar16 = 1;
          do {
            if (p_Var14->type == XML_ELEMENT_NODE) {
              pxVar12 = p_Var14->name;
              if ((p_Var14->ns != (xmlNs *)0x0) &&
                 (pxVar6 = p_Var14->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
                pxVar6 = xmlBuildQName(pxVar12,pxVar6,local_68,0x32);
                if (pxVar6 == (xmlChar *)0x0) {
                  return 0;
                }
                local_70 = CONCAT71((int7)((ulong)elemDecl >> 8),1);
                for (pxVar10 = elemDecl->content; pxVar10 != (xmlElementContentPtr)0x0;
                    pxVar10 = pxVar10->c2) {
                  if (pxVar10->type == XML_ELEMENT_CONTENT_OR) {
                    p_Var2 = pxVar10->c1;
                    if (p_Var2 != (_xmlElementContent *)0x0) {
                      if (p_Var2->type == XML_ELEMENT_CONTENT_ELEMENT) {
                        pxVar17 = p_Var2->name;
                        goto LAB_00192773;
                      }
                      if (p_Var2->type == XML_ELEMENT_CONTENT_PCDATA) goto LAB_00192786;
                    }
LAB_0019278c:
                    local_70 = 0;
                    xmlErrValid((xmlValidCtxtPtr)0x0,XML_DTD_MIXED_CORRUPT,
                                "Internal: MIXED struct corrupted\n",(char *)0x0);
                    break;
                  }
                  if (pxVar10->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_0019278c;
                  pxVar17 = pxVar10->name;
LAB_00192773:
                  iVar3 = xmlStrEqual(pxVar17,pxVar6);
                  if (iVar3 != 0) {
                    local_70 = 0;
                    break;
                  }
LAB_00192786:
                }
                if ((pxVar6 != local_68) && (pxVar6 != p_Var14->name)) {
                  (*xmlFree)(pxVar6);
                }
                if ((char)local_70 == '\0') goto LAB_00192873;
              }
              for (pxVar10 = elemDecl->content; pxVar10 != (xmlElementContentPtr)0x0;
                  pxVar10 = pxVar10->c2) {
                if (pxVar10->type == XML_ELEMENT_CONTENT_OR) {
                  p_Var2 = pxVar10->c1;
                  if (p_Var2 != (_xmlElementContent *)0x0) {
                    if (p_Var2->type == XML_ELEMENT_CONTENT_ELEMENT) {
                      pxVar6 = p_Var2->name;
                      goto LAB_00192810;
                    }
                    if (p_Var2->type == XML_ELEMENT_CONTENT_PCDATA) goto LAB_00192825;
                  }
LAB_00192858:
                  xmlErrValid(ctxt,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",
                              (char *)0x0);
                  goto LAB_00192873;
                }
                if (pxVar10->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00192858;
                pxVar6 = pxVar10->name;
LAB_00192810:
                iVar3 = xmlStrEqual(pxVar6,pxVar12);
                if (iVar3 != 0) goto LAB_00192873;
LAB_00192825:
              }
              xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_CHILD,
                              "Element %s is not declared in %s list of possible children\n",pxVar12
                              ,elem->name,(xmlChar *)0x0);
              iVar16 = 0;
            }
LAB_00192873:
            p_Var14 = p_Var14->next;
          } while (p_Var14 != (_xmlNode *)0x0);
        }
        goto switchD_0019259f_caseD_2;
      }
      iVar3 = xmlValidateOneCdataElement(ctxt,(xmlDocPtr)elem,elem_00);
      if (iVar3 != 0) goto switchD_0019259f_caseD_2;
      pxVar12 = elem->name;
      pcVar7 = "Element %s was declared #PCDATA but contains non text nodes\n";
      xVar8 = XML_DTD_NOT_PCDATA;
      break;
    case XML_ELEMENT_TYPE_ELEMENT:
      iVar16 = 1;
      if ((doc->standalone == 1) && (local_74 == 1)) {
        for (p_Var14 = elem->children; p_Var14 != (_xmlNode *)0x0; p_Var14 = p_Var14->next) {
          if (p_Var14->type == XML_TEXT_NODE) {
            for (pbVar9 = p_Var14->content; uVar11 = (ulong)*pbVar9, uVar11 < 0x21;
                pbVar9 = pbVar9 + 1) {
              if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
                if (uVar11 == 0) {
                  in_R8 = (xmlNodePtr)elem->name;
                  iVar16 = 0;
                  xmlErrValidNode(ctxt,elem,XML_DTD_STANDALONE_WHITE_SPACE,
                                  "standalone: %s declared in the external subset contains white spaces nodes\n"
                                  ,(xmlChar *)in_R8,(xmlChar *)0x0,(xmlChar *)0x0);
                  goto LAB_001928af;
                }
                break;
              }
            }
          }
        }
      }
LAB_001928af:
      iVar3 = xmlValidateElementContent(ctxt,elem->children,elemDecl,(int)elem,in_R8);
      if (iVar3 < 1) {
        iVar16 = iVar3;
      }
      goto switchD_0019259f_caseD_2;
    }
    xmlErrValidNode(ctxt,elem,xVar8,pcVar7,pxVar12,(xmlChar *)0x0,(xmlChar *)0x0);
    iVar16 = 0;
switchD_0019259f_caseD_2:
    pxVar15 = elemDecl->attributes;
    if (pxVar15 == (xmlAttributePtr)0x0) {
      return iVar16;
    }
    ppxVar1 = &elem->nsDef;
    do {
      if (pxVar15->def == XML_ATTRIBUTE_FIXED) {
        pxVar12 = pxVar15->prefix;
        if (pxVar12 == (xmlChar *)0x0) {
          iVar3 = xmlStrEqual(pxVar15->name,"xmlns");
          pxVar5 = (xmlNs *)ppxVar1;
          if (iVar3 != 0) {
            do {
              pxVar5 = pxVar5->next;
              if (pxVar5 == (xmlNs *)0x0) goto LAB_0019247e;
            } while (pxVar5->prefix != (xmlChar *)0x0);
            iVar3 = xmlStrEqual(pxVar15->defaultValue,pxVar5->href);
            if (iVar3 == 0) {
              iVar16 = 0;
              xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_DEFAULT_NAMESPACE,
                              "Element %s namespace name for default namespace does not match the DTD\n"
                              ,elem->name,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            goto LAB_0019247e;
          }
          pxVar12 = pxVar15->prefix;
        }
        iVar3 = xmlStrEqual(pxVar12,"xmlns");
        pxVar5 = (xmlNs *)ppxVar1;
        if (iVar3 != 0) {
          do {
            pxVar5 = pxVar5->next;
            if (pxVar5 == (xmlNs *)0x0) goto LAB_0019247e;
            iVar3 = xmlStrEqual(pxVar15->name,pxVar5->prefix);
          } while (iVar3 == 0);
          iVar3 = xmlStrEqual(pxVar15->defaultValue,pxVar5->href);
          if (iVar3 == 0) {
            pxVar6 = elem->name;
            pxVar12 = pxVar5->prefix;
            pxVar17 = (xmlChar *)0x0;
            xVar8 = XML_DTD_ELEM_NAMESPACE;
            pcVar7 = "Element %s namespace name for %s does not match the DTD\n";
LAB_00192476:
            xmlErrValidNode(ctxt,elem,xVar8,pcVar7,pxVar6,pxVar12,pxVar17);
            iVar16 = 0;
          }
        }
      }
      else if (pxVar15->def == XML_ATTRIBUTE_REQUIRED) {
        pxVar12 = pxVar15->prefix;
        if (pxVar12 == (xmlChar *)0x0) {
          iVar3 = xmlStrEqual(pxVar15->name,"xmlns");
          pxVar5 = (xmlNs *)ppxVar1;
          if (iVar3 != 0) {
            do {
              pxVar5 = pxVar5->next;
              if (pxVar5 == (xmlNs *)0x0) goto LAB_00192430;
            } while (pxVar5->prefix != (xmlChar *)0x0);
            goto LAB_0019247e;
          }
          pxVar12 = pxVar15->prefix;
        }
        iVar3 = xmlStrEqual(pxVar12,"xmlns");
        pxVar5 = (xmlNs *)ppxVar1;
        if (iVar3 == 0) {
          p_Var13 = elem->properties;
          if (p_Var13 == (_xmlAttr *)0x0) {
LAB_00192430:
            pxVar6 = elem->name;
            if (pxVar15->prefix == (xmlChar *)0x0) {
              pxVar17 = (xmlChar *)0x0;
              xVar8 = XML_DTD_MISSING_ATTRIBUTE;
              pcVar7 = "Element %s does not carry attribute %s\n";
              pxVar12 = pxVar15->name;
            }
            else {
              xVar8 = XML_DTD_MISSING_ATTRIBUTE;
              pcVar7 = "Element %s does not carry attribute %s:%s\n";
              pxVar12 = pxVar15->prefix;
              pxVar17 = pxVar15->name;
            }
            goto LAB_00192476;
          }
          iVar3 = -1;
          do {
            iVar4 = xmlStrEqual(p_Var13->name,pxVar15->name);
            if (iVar4 != 0) {
              if (pxVar15->prefix == (xmlChar *)0x0) goto LAB_0019247e;
              pxVar5 = p_Var13->ns;
              if ((pxVar5 == (xmlNs *)0x0) && (pxVar5 = elem->ns, pxVar5 == (xmlNs *)0x0)) {
                if (iVar3 < 1) {
                  iVar3 = 0;
                }
              }
              else {
                iVar4 = xmlStrEqual(pxVar5->prefix,pxVar15->prefix);
                iVar3 = 1;
                if (iVar4 != 0) goto LAB_0019247e;
              }
            }
            p_Var13 = p_Var13->next;
          } while (p_Var13 != (_xmlAttr *)0x0);
          if (iVar3 == 0) {
            xmlErrValidWarning(ctxt,elem,XML_DTD_NO_PREFIX,
                               "Element %s required attribute %s:%s has no prefix\n",elem->name,
                               pxVar15->prefix,pxVar15->name);
          }
          else {
            if (iVar3 == -1) goto LAB_00192430;
            xmlErrValidWarning(ctxt,elem,XML_DTD_DIFFERENT_PREFIX,
                               "Element %s required attribute %s:%s has different prefix\n",
                               elem->name,pxVar15->prefix,pxVar15->name);
          }
        }
        else {
          do {
            pxVar5 = pxVar5->next;
            if (pxVar5 == (xmlNs *)0x0) goto LAB_00192430;
            iVar3 = xmlStrEqual(pxVar15->name,pxVar5->prefix);
          } while (iVar3 == 0);
        }
      }
LAB_0019247e:
      pxVar15 = pxVar15->nexth;
      if (pxVar15 == (_xmlAttribute *)0x0) {
        return iVar16;
      }
    } while( true );
  case XML_ATTRIBUTE_NODE:
    pcVar7 = "Attribute element not expected\n";
    break;
  case XML_TEXT_NODE:
    if (elem->children == (_xmlNode *)0x0) {
      if (elem->ns == (xmlNs *)0x0) {
        if (elem->content != (xmlChar *)0x0) {
          return 1;
        }
        pcVar7 = "Text element has no content !\n";
      }
      else {
        pcVar7 = "Text element has namespace !\n";
      }
    }
    else {
      pcVar7 = "Text element has children !\n";
    }
    break;
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    goto switchD_001921a5_caseD_4;
  case XML_ENTITY_NODE:
    pcVar7 = "Entity element not expected\n";
    break;
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    pcVar7 = "Document element not expected\n";
    break;
  case XML_NOTATION_NODE:
    pcVar7 = "Notation element not expected\n";
    break;
  case XML_HTML_DOCUMENT_NODE:
    pcVar7 = "HTML Document not expected\n";
    break;
  default:
    pcVar7 = "unknown element type\n";
  }
  xVar8 = XML_ERR_INTERNAL_ERROR;
  pxVar12 = (xmlChar *)0x0;
LAB_00192552:
  iVar16 = 0;
  xmlErrValidNode(ctxt,elem,xVar8,pcVar7,pxVar12,(xmlChar *)0x0,(xmlChar *)0x0);
switchD_001921a5_caseD_4:
  return iVar16;
}

Assistant:

int
xmlValidateOneElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                      xmlNodePtr elem) {
    xmlElementPtr elemDecl = NULL;
    xmlElementContentPtr cont;
    xmlAttributePtr attr;
    xmlNodePtr child;
    int ret = 1, tmp;
    const xmlChar *name;
    int extsubset = 0;

    CHECK_DTD;

    if (elem == NULL) return(0);
    switch (elem->type) {
        case XML_ATTRIBUTE_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Attribute element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_TEXT_NODE:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has children !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->ns != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has namespace !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->content == NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has no content !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    return(1);
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return(1);
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(1);
        case XML_ENTITY_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Entity element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_NOTATION_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Notation element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Document element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_HTML_DOCUMENT_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "HTML Document not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_ELEMENT_NODE:
	    break;
	default:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "unknown element type\n", NULL, NULL ,NULL);
	    return(0);
    }

    /*
     * Fetch the declaration
     */
    elemDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    if (elemDecl == NULL)
	return(0);

    /*
     * If vstateNr is not zero that means continuous validation is
     * activated, do not try to check the content model at that level.
     */
    if (ctxt->vstateNr == 0) {
    /* Check that the element content matches the definition */
    switch (elemDecl->etype) {
        case XML_ELEMENT_TYPE_UNDEFINED:
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ELEM,
	                    "No declaration for element %s\n",
		   elem->name, NULL, NULL);
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
	               elem->name, NULL, NULL);
		ret = 0;
	    }
	    break;
        case XML_ELEMENT_TYPE_ANY:
	    /* I don't think anything is required then */
	    break;
        case XML_ELEMENT_TYPE_MIXED:

	    /* simple case of declared as #PCDATA */
	    if ((elemDecl->content != NULL) &&
		(elemDecl->content->type == XML_ELEMENT_CONTENT_PCDATA)) {
		ret = xmlValidateOneCdataElement(ctxt, doc, elem);
		if (!ret) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
			   elem->name, NULL, NULL);
		}
		break;
	    }
	    child = elem->children;
	    /* Hum, this start to get messy */
	    while (child != NULL) {
	        if (child->type == XML_ELEMENT_NODE) {
		    name = child->name;
		    if ((child->ns != NULL) && (child->ns->prefix != NULL)) {
			xmlChar fn[50];
			xmlChar *fullname;

			fullname = xmlBuildQName(child->name, child->ns->prefix,
				                 fn, 50);
			if (fullname == NULL)
			    return(0);
			cont = elemDecl->content;
			while (cont != NULL) {
			    if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
				if (xmlStrEqual(cont->name, fullname))
				    break;
			    } else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			       (cont->c1 != NULL) &&
			       (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)){
				if (xmlStrEqual(cont->c1->name, fullname))
				    break;
			    } else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
				(cont->c1 == NULL) ||
				(cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)){
				xmlErrValid(NULL, XML_DTD_MIXED_CORRUPT,
					"Internal: MIXED struct corrupted\n",
					NULL);
				break;
			    }
			    cont = cont->c2;
			}
			if ((fullname != fn) && (fullname != child->name))
			    xmlFree(fullname);
			if (cont != NULL)
			    goto child_ok;
		    }
		    cont = elemDecl->content;
		    while (cont != NULL) {
		        if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
			    if (xmlStrEqual(cont->name, name)) break;
			} else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			   (cont->c1 != NULL) &&
			   (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)) {
			    if (xmlStrEqual(cont->c1->name, name)) break;
			} else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
			    (cont->c1 == NULL) ||
			    (cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)) {
			    xmlErrValid(ctxt, XML_DTD_MIXED_CORRUPT,
				    "Internal: MIXED struct corrupted\n",
				    NULL);
			    break;
			}
			cont = cont->c2;
		    }
		    if (cont == NULL) {
			xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
			       name, elem->name, NULL);
			ret = 0;
		    }
		}
child_ok:
	        child = child->next;
	    }
	    break;
        case XML_ELEMENT_TYPE_ELEMENT:
	    if ((doc->standalone == 1) && (extsubset == 1)) {
		/*
		 * VC: Standalone Document Declaration
		 *     - element types with element content, if white space
		 *       occurs directly within any instance of those types.
		 */
		child = elem->children;
		while (child != NULL) {
		    if (child->type == XML_TEXT_NODE) {
			const xmlChar *content = child->content;

			while (IS_BLANK_CH(*content))
			    content++;
			if (*content == 0) {
			    xmlErrValidNode(ctxt, elem,
			                    XML_DTD_STANDALONE_WHITE_SPACE,
"standalone: %s declared in the external subset contains white spaces nodes\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			    break;
			}
		    }
		    child =child->next;
		}
	    }
	    child = elem->children;
	    cont = elemDecl->content;
	    tmp = xmlValidateElementContent(ctxt, child, elemDecl, 1, elem);
	    if (tmp <= 0)
		ret = tmp;
	    break;
    }
    } /* not continuous */

    /* [ VC: Required Attribute ] */
    attr = elemDecl->attributes;
    while (attr != NULL) {
	if (attr->def == XML_ATTRIBUTE_REQUIRED) {
	    int qualified = -1;

	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL)
			goto found;
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix))
			goto found;
		    ns = ns->next;
		}
	    } else {
		xmlAttrPtr attrib;

		attrib = elem->properties;
		while (attrib != NULL) {
		    if (xmlStrEqual(attrib->name, attr->name)) {
			if (attr->prefix != NULL) {
			    xmlNsPtr nameSpace = attrib->ns;

			    if (nameSpace == NULL)
				nameSpace = elem->ns;
			    /*
			     * qualified names handling is problematic, having a
			     * different prefix should be possible but DTDs don't
			     * allow to define the URI instead of the prefix :-(
			     */
			    if (nameSpace == NULL) {
				if (qualified < 0)
				    qualified = 0;
			    } else if (!xmlStrEqual(nameSpace->prefix,
						    attr->prefix)) {
				if (qualified < 1)
				    qualified = 1;
			    } else
				goto found;
			} else {
			    /*
			     * We should allow applications to define namespaces
			     * for their application even if the DTD doesn't
			     * carry one, otherwise, basically we would always
			     * break.
			     */
			    goto found;
			}
		    }
		    attrib = attrib->next;
		}
	    }
	    if (qualified == -1) {
		if (attr->prefix == NULL) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s\n",
			   elem->name, attr->name, NULL);
		    ret = 0;
	        } else {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s:%s\n",
			   elem->name, attr->prefix,attr->name);
		    ret = 0;
		}
	    } else if (qualified == 0) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_NO_PREFIX,
		   "Element %s required attribute %s:%s has no prefix\n",
		       elem->name, attr->prefix, attr->name);
	    } else if (qualified == 1) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_DIFFERENT_PREFIX,
		   "Element %s required attribute %s:%s has different prefix\n",
		       elem->name, attr->prefix, attr->name);
	    }
	} else if (attr->def == XML_ATTRIBUTE_FIXED) {
	    /*
	     * Special tests checking #FIXED namespace declarations
	     * have the right value since this is not done as an
	     * attribute checking
	     */
	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem,
			           XML_DTD_ELEM_DEFAULT_NAMESPACE,
   "Element %s namespace name for default namespace does not match the DTD\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix)) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Element %s namespace name for %s does not match the DTD\n",
				   elem->name, ns->prefix, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    }
	}
found:
        attr = attr->nexth;
    }
    return(ret);
}